

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  string *this_00;
  bool bVar1;
  bool bVar2;
  reference ppTVar3;
  char *pcVar4;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *pvVar5;
  TestInfo *pTVar6;
  reference ppTVar7;
  bool local_239;
  byte local_22f;
  byte local_22e;
  bool local_22d;
  bool local_22a;
  int local_1e8;
  int local_1e4;
  allocator local_1d1;
  undefined1 local_1d0 [2];
  bool is_selected;
  bool is_in_another_shard;
  bool is_runnable;
  bool matches_filter;
  bool is_disabled;
  string test_name;
  TestInfo *test_info;
  size_t j;
  string local_198;
  string *local_178;
  string *test_suite_name;
  TestSuite *test_suite;
  iterator __end2;
  iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  int local_148;
  int num_selected_tests;
  int num_runnable_tests;
  allocator local_131;
  string local_130;
  undefined1 local_110 [8];
  UnitTestFilter disable_test_filter;
  PositiveAndNegativeUnitTestFilter gtest_flag_filter;
  int32_t shard_index;
  int32_t total_shards;
  ReactionToSharding shard_tests_local;
  UnitTestImpl *this_local;
  
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_1e4 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    local_1e8 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  else {
    local_1e4 = -1;
    local_1e8 = -1;
  }
  anon_unknown_35::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
            ((PositiveAndNegativeUnitTestFilter *)
             &disable_test_filter.exact_match_patterns_._M_h._M_single_bucket,
             (string *)FLAGS_gtest_filter_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"DISABLED_*:*/DISABLED_*",&local_131);
  anon_unknown_35::UnitTestFilter::UnitTestFilter((UnitTestFilter *)local_110,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_148 = 0;
  __range2._4_4_ = 0;
  __end2 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                     (&this->test_suites_);
  test_suite = (TestSuite *)
               std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                         (&this->test_suites_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                                     *)&test_suite), bVar1) {
    ppTVar3 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&__end2);
    test_suite_name = (string *)*ppTVar3;
    pcVar4 = TestSuite::name((TestSuite *)test_suite_name);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,pcVar4,(allocator *)((long)&j + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&j + 7));
    local_178 = &local_198;
    TestSuite::set_should_run((TestSuite *)test_suite_name,false);
    test_info = (TestInfo *)0x0;
    while( true ) {
      pvVar5 = TestSuite::test_info_list((TestSuite *)test_suite_name);
      pTVar6 = (TestInfo *)
               std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size(pvVar5);
      if (pTVar6 <= test_info) break;
      pvVar5 = TestSuite::test_info_list((TestSuite *)test_suite_name);
      ppTVar7 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (pvVar5,(size_type_conflict)test_info);
      test_name.field_2._8_8_ = *ppTVar7;
      pcVar4 = TestInfo::name((TestInfo *)test_name.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_1d0,pcVar4,&local_1d1);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      bVar1 = anon_unknown_35::UnitTestFilter::MatchesName((UnitTestFilter *)local_110,local_178);
      local_22a = true;
      if (!bVar1) {
        local_22a = anon_unknown_35::UnitTestFilter::MatchesName
                              ((UnitTestFilter *)local_110,(string *)local_1d0);
      }
      *(bool *)(test_name.field_2._8_8_ + 0x81) = local_22a;
      bVar1 = anon_unknown_35::PositiveAndNegativeUnitTestFilter::MatchesTest
                        ((PositiveAndNegativeUnitTestFilter *)
                         &disable_test_filter.exact_match_patterns_._M_h._M_single_bucket,local_178,
                         (string *)local_1d0);
      *(bool *)(test_name.field_2._8_8_ + 0x82) = bVar1;
      if (((FLAGS_gtest_also_run_disabled_tests & 1) != 0) ||
         (local_22d = false, local_22a == false)) {
        local_22d = bVar1;
      }
      local_22e = 0;
      if (shard_tests != IGNORE_SHARDING_PROTOCOL) {
        bVar1 = ShouldRunTestOnShard(local_1e4,local_1e8,local_148);
        local_22e = bVar1 ^ 0xff;
      }
      this_00 = test_suite_name;
      *(byte *)(test_name.field_2._8_8_ + 0x83) = local_22e & 1;
      local_22f = 0;
      if (local_22d != false) {
        local_22f = local_22e & 1 ^ 0xff;
      }
      bVar1 = (bool)(local_22f & 1);
      local_148 = local_148 + (uint)local_22d;
      __range2._4_4_ = __range2._4_4_ + (uint)bVar1;
      *(bool *)(test_name.field_2._8_8_ + 0x80) = bVar1;
      bVar2 = TestSuite::should_run((TestSuite *)test_suite_name);
      local_239 = true;
      if (!bVar2) {
        local_239 = bVar1;
      }
      TestSuite::set_should_run((TestSuite *)this_00,local_239);
      std::__cxx11::string::~string((string *)local_1d0);
      test_info = (TestInfo *)&(test_info->test_suite_name_).field_0x1;
    }
    std::__cxx11::string::~string((string *)&local_198);
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&__end2);
  }
  anon_unknown_35::UnitTestFilter::~UnitTestFilter((UnitTestFilter *)local_110);
  anon_unknown_35::PositiveAndNegativeUnitTestFilter::~PositiveAndNegativeUnitTestFilter
            ((PositiveAndNegativeUnitTestFilter *)
             &disable_test_filter.exact_match_patterns_._M_h._M_single_bucket);
  return __range2._4_4_;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL
                                   ? Int32FromEnvOrDie(kTestTotalShards, -1)
                                   : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL
                                  ? Int32FromEnvOrDie(kTestShardIndex, -1)
                                  : -1;

  const PositiveAndNegativeUnitTestFilter gtest_flag_filter(
      GTEST_FLAG_GET(filter));
  const UnitTestFilter disable_test_filter(kDisableTestFilter);
  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name();
    test_suite->set_should_run(false);

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      TestInfo* const test_info = test_suite->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          disable_test_filter.MatchesName(test_suite_name) ||
          disable_test_filter.MatchesName(test_name);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          gtest_flag_filter.MatchesTest(test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG_GET(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}